

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

uint32_t BrotliBuildHuffmanTable
                   (HuffmanCode *root_table,int root_bits,uint16_t *symbol_lists,uint16_t *count)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint local_f4;
  int local_f0;
  int bits_count;
  int bits;
  int max_length;
  int total_size;
  int table_size;
  int table_bits;
  int step;
  uint64_t sub_key_step;
  uint64_t sub_key;
  uint64_t key_step;
  uint64_t key;
  int symbol;
  int len;
  HuffmanCode *table;
  HuffmanCode code;
  uint16_t *count_local;
  uint16_t *symbol_lists_local;
  int root_bits_local;
  HuffmanCode *root_table_local;
  HuffmanCode h_2;
  HuffmanCode h_1;
  int local_68;
  HuffmanCode h;
  int local_50;
  int local_1c;
  int left;
  
  for (bits_count = -1; symbol_lists[bits_count] == 0xffff; bits_count = bits_count + -1) {
  }
  iVar2 = bits_count + 0x10;
  bVar3 = (byte)root_bits;
  bits = 1 << (bVar3 & 0x1f);
  max_length = bits;
  total_size = root_bits;
  if (iVar2 < root_bits) {
    max_length = 1 << ((byte)iVar2 & 0x1f);
    total_size = iVar2;
  }
  key_step = 0;
  sub_key = 0x80;
  local_f0 = 1;
  table_size = 2;
  do {
    key._0_4_ = local_f0 - 0x10;
    for (local_f4 = (uint)count[local_f0]; local_f4 != 0; local_f4 = local_f4 - 1) {
      lVar5 = (long)(int)(uint)key;
      key._0_4_ = (uint)symbol_lists[lVar5];
      h_1.bits = (uint8_t)local_f0;
      h_1.value = symbol_lists[lVar5];
      bVar4 = kReverseBits[key_step];
      local_50 = max_length;
      do {
        local_50 = local_50 - table_size;
        root_table[(ulong)bVar4 + (long)local_50] = h_1;
      } while (0 < local_50);
      key_step = sub_key + key_step;
    }
    table_size = table_size << 1;
    sub_key = sub_key >> 1;
    local_f0 = local_f0 + 1;
  } while (local_f0 <= total_size);
  for (; bits != max_length; max_length = max_length << 1) {
    memcpy(root_table + max_length,root_table,(long)max_length << 2);
  }
  sub_key_step = 0x100;
  _table_bits = 0x80;
  table_size = 2;
  _symbol = root_table;
  for (key._4_4_ = root_bits + 1; key._4_4_ <= iVar2; key._4_4_ = key._4_4_ + 1) {
    key._0_4_ = key._4_4_ - 0x10;
    while (count[key._4_4_] != 0) {
      if (sub_key_step == 0x100) {
        _symbol = _symbol + max_length;
        left = key._4_4_;
        for (local_1c = 1 << ((char)key._4_4_ - bVar3 & 0x1f);
            (left < 0xf && (lVar5 = (long)left, 0 < (int)(local_1c - (uint)count[lVar5])));
            local_1c = (local_1c - (uint)count[lVar5]) * 2) {
          left = left + 1;
        }
        bVar4 = (char)left - bVar3;
        max_length = 1 << (bVar4 & 0x1f);
        bits = max_length + bits;
        pbVar1 = kReverseBits + key_step;
        key_step = (0x80UL >> (bVar3 - 1 & 0x3f)) + key_step;
        h_2.bits = bVar4 + bVar3;
        h_2.value = (short)((long)_symbol - (long)root_table >> 2) - (ushort)*pbVar1;
        root_table[*pbVar1] = h_2;
        sub_key_step = 0;
      }
      lVar5 = (long)(int)(uint)key;
      key._0_4_ = (uint)symbol_lists[lVar5];
      root_table_local._4_4_ = (HuffmanCode)CONCAT31(root_table_local._5_3_,(char)key._4_4_ - bVar3)
      ;
      root_table_local._4_4_ = (HuffmanCode)CONCAT22(symbol_lists[lVar5],root_table_local._4_2_);
      bVar4 = kReverseBits[sub_key_step];
      local_68 = max_length;
      do {
        local_68 = local_68 - table_size;
        _symbol[(ulong)bVar4 + (long)local_68] = root_table_local._4_4_;
      } while (0 < local_68);
      sub_key_step = _table_bits + sub_key_step;
      count[key._4_4_] = count[key._4_4_] - 1;
    }
    table_size = table_size << 1;
    _table_bits = _table_bits >> 1;
  }
  return bits;
}

Assistant:

uint32_t BrotliBuildHuffmanTable(HuffmanCode* root_table,
                                 int root_bits,
                                 const uint16_t* const symbol_lists,
                                 uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  HuffmanCode* table;     /* next available space in table */
  int len;                /* current code length */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  brotli_reg_t sub_key;   /* 2nd level table prefix code */
  brotli_reg_t sub_key_step;  /* 2nd level table prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_bits;         /* key length of current table */
  int table_size;         /* size of current table */
  int total_size;         /* sum of root table size and 2nd level table sizes */
  int max_length = -1;
  int bits;
  int bits_count;

  BROTLI_DCHECK(root_bits <= BROTLI_REVERSE_BITS_MAX);
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH - root_bits <=
                BROTLI_REVERSE_BITS_MAX);

  while (symbol_lists[max_length] == 0xFFFF) max_length--;
  max_length += BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1;

  table = root_table;
  table_bits = root_bits;
  table_size = 1 << table_bits;
  total_size = table_size;

  /* Fill in the root table. Reduce the table size to if possible,
     and create the repetitions by memcpy. */
  if (table_bits > max_length) {
    table_bits = max_length;
    table_size = 1 << table_bits;
  }
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  bits = 1;
  step = 2;
  do {
    symbol = bits - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)symbol);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= table_bits);

  /* If root_bits != table_bits then replicate to fill the remaining slots. */
  while (total_size != table_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }

  /* Fill in 2nd level tables and add pointers to root table. */
  key_step = BROTLI_REVERSE_BITS_LOWEST >> (root_bits - 1);
  sub_key = (BROTLI_REVERSE_BITS_LOWEST << 1);
  sub_key_step = BROTLI_REVERSE_BITS_LOWEST;
  for (len = root_bits + 1, step = 2; len <= max_length; ++len) {
    symbol = len - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (; count[len] != 0; --count[len]) {
      if (sub_key == (BROTLI_REVERSE_BITS_LOWEST << 1U)) {
        table += table_size;
        table_bits = NextTableBitSize(count, len, root_bits);
        table_size = 1 << table_bits;
        total_size += table_size;
        sub_key = BrotliReverseBits(key);
        key += key_step;
        root_table[sub_key] = ConstructHuffmanCode(
            (uint8_t)(table_bits + root_bits),
            (uint16_t)(((size_t)(table - root_table)) - sub_key));
        sub_key = 0;
      }
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)(len - root_bits), (uint16_t)symbol);
      ReplicateValue(
          &table[BrotliReverseBits(sub_key)], step, table_size, code);
      sub_key += sub_key_step;
    }
    step <<= 1;
    sub_key_step >>= 1;
  }
  return (uint32_t)total_size;
}